

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeDebugExpression(Builder *this)

{
  uint uVar1;
  Id IVar2;
  Instruction *this_00;
  pointer *__ptr;
  Id IVar3;
  _Head_base<0UL,_spv::Instruction_*,_false> local_28;
  
  uVar1 = this->debugExpression;
  local_28._M_head_impl = (Instruction *)(ulong)uVar1;
  if (uVar1 != 0) {
    return uVar1;
  }
  this_00 = (Instruction *)operator_new(0x60);
  IVar3 = this->uniqueId + 1;
  this->uniqueId = IVar3;
  IVar2 = makeVoidType(this);
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  this_00->resultId = IVar3;
  this_00->typeId = IVar2;
  this_00->opCode = OpExtInst;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00->block = (Block *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_00->operands,2);
  if ((this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&this_00->idOperand,2);
  }
  Instruction::addIdOperand(this_00,this->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(this_00,0x1f);
  local_28._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_28);
  if (local_28._M_head_impl != (Instruction *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,this_00);
  IVar2 = this_00->resultId;
  this->debugExpression = IVar2;
  return IVar2;
}

Assistant:

Id Builder::makeDebugExpression()
{
    if (debugExpression != 0)
        return debugExpression;

    Instruction* inst = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    inst->reserveOperands(2);
    inst->addIdOperand(nonSemanticShaderDebugInfo);
    inst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugExpression);

    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
    module.mapInstruction(inst);

    debugExpression = inst->getResultId();

    return debugExpression;
}